

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void SetIWork(int m,int n,int panel_size,int *iworkptr,int **segrep,int **parent,int_t **xplore,
             int **repfnz,int **panel_lsub,int_t **xprune,int **marker)

{
  int_t *piVar1;
  int **parent_local;
  int **segrep_local;
  int *iworkptr_local;
  int panel_size_local;
  int n_local;
  int m_local;
  
  *segrep = iworkptr;
  *parent = iworkptr + m;
  *repfnz = *parent + m;
  *panel_lsub = *repfnz + panel_size * m;
  *marker = *panel_lsub + panel_size * m;
  ifill(*repfnz,m * panel_size,-1);
  ifill(*panel_lsub,m * panel_size,-1);
  piVar1 = intMalloc(m);
  *xplore = piVar1;
  piVar1 = intMalloc(n);
  *xprune = piVar1;
  return;
}

Assistant:

void
SetIWork(int m, int n, int panel_size, int *iworkptr, int **segrep,
	 int **parent, int_t **xplore, int **repfnz, int **panel_lsub,
	 int_t **xprune, int **marker)
{
    *segrep = iworkptr;
    *parent = iworkptr + m;
    //    *xplore = *parent + m;
    *repfnz = *parent + m;
    *panel_lsub = *repfnz + panel_size * m;
    //    *xprune = *panel_lsub + panel_size * m;
    // *marker = *xprune + n;
    *marker = *panel_lsub + panel_size * m;
    
    ifill (*repfnz, m * panel_size, SLU_EMPTY);
    ifill (*panel_lsub, m * panel_size, SLU_EMPTY);
    
    *xplore = intMalloc(m); /* can be 64 bit */
    *xprune = intMalloc(n);
}